

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O0

RealType __thiscall OpenMD::CubicSpline::getSpacing(CubicSpline *this)

{
  long in_RDI;
  CubicSpline *in_stack_00000380;
  undefined8 local_8;
  
  if ((*(byte *)(in_RDI + 9) & 1) == 0) {
    generate(in_stack_00000380);
  }
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    local_8 = 0.0;
  }
  else {
    local_8 = 1.0 / *(double *)(in_RDI + 0x10);
  }
  return local_8;
}

Assistant:

RealType CubicSpline::getSpacing() {
    if (!generated) generate();
    assert(isUniform);
    if (isUniform)
      return 1.0 / dx;
    else
      return 0.0;
  }